

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ThrowGrenade
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  DObject *this;
  void *pvVar3;
  AWeapon *this_00;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  uint uVar12;
  AActor *missile;
  int val;
  char *pcVar13;
  PClassActor *type;
  AActor *this_01;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double local_a8;
  undefined8 local_78;
  DVector3 local_48;
  
  if (numparam < 1) {
LAB_003e2bae:
    pcVar13 = "(paramnum) < numparam";
LAB_003e2bca:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e2ba5:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003e2bca;
  }
  this_01 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (AActor *)0x0) goto LAB_003e2698;
    bVar11 = DObject::IsKindOf((DObject *)this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar11) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e2bca;
    }
  }
  else {
    if (this_01 != (AActor *)0x0) goto LAB_003e2ba5;
LAB_003e2698:
    this_01 = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_003e2bae;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003e2ba5;
  this = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if ((this != (DObject *)0x0) &&
       (bVar11 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar11)) {
      pcVar13 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e2bca;
    }
  }
  else if (this != (DObject *)0x0) goto LAB_003e2ba5;
  if ((uint)numparam < 3) goto LAB_003e2bae;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar13 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003e2bca;
  }
  if (numparam == 3) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_003e2c61;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_003e2bb7:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e2c61:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pvVar3 = param[2].field_0.field_1.a;
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003e2754;
    bVar11 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar11) {
      pcVar13 = "missile == NULL || missile->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e2c61;
    }
    bVar11 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003e2bb7;
LAB_003e2754:
    bVar11 = true;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e2c42;
    }
    uVar18 = (undefined4)*(undefined8 *)&param[4].field_0;
    uVar19 = (undefined4)((ulong)*(undefined8 *)&param[4].field_0 >> 0x20);
LAB_003e2793:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e2c9f:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar20 = param[5].field_0.f;
LAB_003e27a4:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e2c11:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,2999,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar14 = (undefined4)*(undefined8 *)&param[6].field_0;
    uVar16 = (undefined4)((ulong)*(undefined8 *)&param[6].field_0 >> 0x20);
LAB_003e27b5:
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e2bf2:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,3000,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003e2c42:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb5,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar18 = (undefined4)*(undefined8 *)&param[4].field_0;
    uVar19 = (undefined4)((ulong)*(undefined8 *)&param[4].field_0 >> 0x20);
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e2793;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e2c9f;
    }
    dVar20 = param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003e27a4;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e2c11;
    }
    uVar14 = (undefined4)*(undefined8 *)&param[6].field_0;
    uVar16 = (undefined4)((ulong)*(undefined8 *)&param[6].field_0 >> 0x20);
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003e27b5;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e2bf2;
    }
  }
  if (bVar11) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbbc,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else if ((pvVar3 == (void *)0x0 || this_01->player == (player_t *)0x0) ||
          (*(int *)((long)pvVar3 + 8) != 1)) {
LAB_003e284d:
    dVar1 = this_01->Floorclip;
    dVar5 = AActor::GetBobOffset(this_01,0.0);
    uVar15 = 0;
    uVar17 = 0;
    if (this_01->player != (player_t *)0x0) {
      dVar2 = this_01->player->crouchoffset;
      uVar15 = SUB84(dVar2,0);
      uVar17 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    local_48.Z = (double)CONCAT44(uVar19,uVar18) + (dVar5 - dVar1) + 35.0 +
                 (double)CONCAT44(uVar17,uVar15) + (this_01->__Pos).Z;
    local_48.X = (this_01->__Pos).X;
    local_48.Y = (this_01->__Pos).Y;
    missile = Spawn(type,&local_48,ALLOW_REPLACE);
    if (missile == (AActor *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbf4,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      val = 0;
      goto LAB_003e2aa9;
    }
    P_PlaySpawnSound(missile,this_01);
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      missile->Speed = dVar20;
    }
    uVar12 = FRandom::operator()(&pr_grenade);
    dVar2 = (double)(int)((uVar12 & 7) - 4) * 1.40625 + (this_01->Angles).Yaw.Degrees;
    (missile->Angles).Yaw.Degrees = dVar2;
    dVar20 = (this_01->Angles).Pitch.Degrees;
    local_a8 = -dVar20;
    dVar1 = missile->Speed;
    local_78 = (double)CONCAT44(uVar16,uVar14);
    dVar21 = fastcosdeg(-dVar20);
    dVar20 = missile->Speed;
    dVar6 = fastsindeg(local_a8);
    dVar7 = fastcosdeg(dVar2);
    dVar8 = fastsindeg(dVar2);
    dVar5 = (this_01->Angles).Pitch.Degrees;
    dVar9 = fastsindeg(dVar5);
    dVar5 = fastcosdeg(dVar5);
    dVar10 = fastcosdeg(dVar2);
    dVar2 = fastsindeg(dVar2);
    dVar21 = dVar21 * dVar1;
    dVar1 = (this_01->Vel).X * 0.5 + dVar21 * dVar7 + dVar10 * dVar9 * local_78;
    dVar2 = (this_01->Vel).Y * 0.5 + dVar9 * local_78 * dVar2 + dVar8 * dVar21;
    auVar4._8_4_ = SUB84(dVar2,0);
    auVar4._0_8_ = dVar1;
    auVar4._12_4_ = (int)((ulong)dVar2 >> 0x20);
    (missile->Vel).X = dVar1;
    (missile->Vel).Y = (double)auVar4._8_8_;
    (missile->Vel).Z = dVar5 * (double)CONCAT44(uVar16,uVar14) + dVar6 * dVar20;
    (missile->target).field_0.p = this_01;
    P_CheckMissileSpawn(missile,this_01->radius);
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbf6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    this_00 = this_01->player->ReadyWeapon;
    if (this_00 == (AWeapon *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbc5,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if ((param[7].field_0.i == 0) ||
         (bVar11 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), bVar11))
      goto LAB_003e284d;
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbc9,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
  val = 1;
LAB_003e2aa9:
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrowGrenade)
{
		PARAM_ACTION_PROLOGUE(AActor);
	PARAM_CLASS		(missile, AActor);
		PARAM_FLOAT_DEF	(zheight)	
		PARAM_FLOAT_DEF	(xyvel)		
		PARAM_FLOAT_DEF	(zvel)		
		PARAM_BOOL_DEF	(useammo)	

	if (missile == NULL)
	{
		ACTION_RETURN_BOOL(true);
	}
	if (ACTION_CALL_FROM_PSPRITE())
	{
		// Used from a weapon, so use some ammo
		AWeapon *weapon = self->player->ReadyWeapon;

		if (weapon == NULL)
		{
			ACTION_RETURN_BOOL(true);
		}
		if (useammo && !weapon->DepleteAmmo(weapon->bAltFire))
		{
			ACTION_RETURN_BOOL(true);
		}
	}

	AActor *bo;

	bo = Spawn(missile, 
			self->PosPlusZ(-self->Floorclip + self->GetBobOffset() + zheight + 35 + (self->player? self->player->crouchoffset : 0.)),
			ALLOW_REPLACE);
	if (bo)
	{
		P_PlaySpawnSound(bo, self);
		if (xyvel != 0)
			bo->Speed = xyvel;
		bo->Angles.Yaw = self->Angles.Yaw + (((pr_grenade()&7) - 4) * (360./256.));

		DAngle pitch = -self->Angles.Pitch;
		DAngle angle = bo->Angles.Yaw;

		// There are two vectors we are concerned about here: xy and z. We rotate
		// them separately according to the shooter's pitch and then sum them to
		// get the final velocity vector to shoot with.

		double xy_xyscale = bo->Speed * pitch.Cos();
		double xy_velz = bo->Speed * pitch.Sin();
		double xy_velx = xy_xyscale * angle.Cos();
		double xy_vely = xy_xyscale * angle.Sin();

		pitch = self->Angles.Pitch;
		double z_xyscale = zvel * pitch.Sin();
		double z_velz = zvel * pitch.Cos();
		double z_velx = z_xyscale * angle.Cos();
		double z_vely = z_xyscale * angle.Sin();

		bo->Vel.X = xy_velx + z_velx + self->Vel.X / 2;
		bo->Vel.Y = xy_vely + z_vely + self->Vel.Y / 2;
		bo->Vel.Z = xy_velz + z_velz;

		bo->target = self;
		P_CheckMissileSpawn (bo, self->radius);
	} 
	else
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}